

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3SnippetFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  char **ppIter;
  sqlite3_module *pTokenizer;
  char cVar1;
  bool bVar2;
  sqlite3_tokenizer_cursor *psVar3;
  void *pvVar4;
  int iVar5;
  i64 iVar6;
  long lVar7;
  ulong uVar8;
  uchar *puVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  code *xDel;
  int iVar13;
  ulong uVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  long *plVar18;
  Fts3Table *p;
  char *pcVar19;
  sqlite3_vtab *psVar20;
  long lVar21;
  Fts3Cursor *pCsr_00;
  sqlite3_tokenizer_module *psVar22;
  ulong local_1d8;
  int iBegin;
  uchar *local_1c8;
  sqlite3_tokenizer_module *local_1c0;
  ulong local_1b8;
  int local_1b0;
  int local_1ac;
  int iCurrent;
  int iCurrent_1;
  ulong local_1a0;
  sqlite3_tokenizer_cursor *local_198;
  sqlite3_tokenizer_module *local_190;
  sqlite3_tokenizer_cursor *pC;
  int local_17c;
  StrBuffer res;
  sqlite3_tokenizer_cursor *pC_1;
  undefined4 local_160;
  int local_15c;
  ulong local_158;
  void *pvStack_150;
  undefined8 local_148;
  ulong local_140;
  sqlite3_context *local_138;
  Fts3Table *local_130;
  ulong local_128;
  int nList;
  Fts3Cursor *local_118;
  ulong local_110;
  ulong local_108;
  sqlite3_vtab *local_100;
  char *pCsr_1;
  int DUMMY1;
  int local_ec;
  int DUMMY2;
  int DUMMY1_1;
  uchar *local_e0;
  i64 local_d8;
  int *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  uchar *local_b0;
  uchar *local_a8;
  Fts3Cursor *pCsr;
  int local_98 [2];
  ulong auStack_90 [12];
  
  if (6 < nVal) {
    sqlite3_result_error(pContext,"wrong number of arguments to function snippet()",-1);
    return;
  }
  iVar5 = fts3FunctionArg(pContext,"snippet",*apVal,&pCsr);
  if (iVar5 != 0) {
    return;
  }
  iVar6 = 0xf;
  local_1c0 = (sqlite3_tokenizer_module *)0xffffffffffffffff;
  pcVar19 = "<b>...</b>";
  local_b0 = "</b>";
  switch(nVal) {
  case 6:
    iVar6 = sqlite3VdbeIntValue(apVal[5]);
  case 5:
    local_1c0 = (sqlite3_tokenizer_module *)sqlite3VdbeIntValue(apVal[4]);
  case 4:
    pcVar19 = (char *)sqlite3_value_text(apVal[3]);
  case 3:
    local_b0 = sqlite3_value_text(apVal[2]);
  case 2:
    local_a8 = sqlite3_value_text(apVal[1]);
    break;
  default:
    local_a8 = "<b>";
  }
  if ((local_b0 == (uchar *)0x0 || (uchar *)pcVar19 == (uchar *)0x0) || local_a8 == (uchar *)0x0) {
    sqlite3_result_error_nomem(pContext);
    return;
  }
  if ((int)iVar6 == 0) {
    sqlite3_result_text(pContext,"",-1,(_func_void_void_ptr *)0x0);
    return;
  }
  local_e0 = (uchar *)pcVar19;
  local_d8 = iVar6;
  iVar5 = fts3CursorSeek(pContext,pCsr);
  if (iVar5 != 0) {
    return;
  }
  p = (Fts3Table *)(pCsr->base).pVtab;
  res.z = (char *)0x0;
  res.n = 0;
  res.nAlloc = 0;
  if (pCsr->pExpr != (Fts3Expr *)0x0) {
    iVar5 = -0x40;
    if (-0x40 < (int)local_d8) {
      iVar5 = (int)local_d8;
    }
    iVar13 = 0x40;
    if (iVar5 < 0x40) {
      iVar13 = iVar5;
    }
    uVar16 = -iVar13;
    local_c0 = (ulong)(iVar13 - 1);
    uVar8 = 1;
    local_17c = 7;
    local_118 = pCsr;
    local_140 = CONCAT44(local_140._4_4_,uVar16);
    pCsr_00 = pCsr;
    local_138 = pContext;
    local_130 = p;
    do {
      local_1a0 = (ulong)uVar16;
      if (-1 < (int)local_d8) {
        local_1a0 = (long)((int)local_c0 + (int)uVar8) / (long)(int)uVar8 & 0xffffffff;
      }
      local_1b8 = 0;
      local_1d8 = 0;
      uVar11 = 0;
      local_c8 = uVar8;
      while (uVar11 != uVar8) {
        local_d0 = local_98 + uVar11 * 6;
        auStack_90[uVar11 * 3 + 1] = 0;
        local_d0[0] = 0;
        local_d0[1] = 0;
        auStack_90[uVar11 * 3] = 0;
        iVar5 = -1;
        local_b8 = uVar11;
        for (iVar13 = 0; iVar13 < p->nColumn; iVar13 = iVar13 + 1) {
          if ((int)local_1c0 < 0 || iVar13 == (int)local_1c0) {
            local_190 = (sqlite3_tokenizer_module *)CONCAT44(local_190._4_4_,iVar5);
            local_1c8 = (uchar *)CONCAT44(local_1c8._4_4_,iVar13);
            local_158 = 0;
            pvStack_150 = (void *)0x0;
            local_148 = 0;
            iVar5 = fts3ExprLoadDoclists(pCsr_00,&nList,(int *)0x0);
            p = local_130;
            iVar13 = iVar5;
            if (iVar5 != 0) goto LAB_001acafd;
            lVar7 = (long)nList;
            pvStack_150 = sqlite3_malloc64(lVar7 * 0x30);
            p = local_130;
            iVar5 = local_17c;
            iVar13 = local_17c;
            if (pvStack_150 == (void *)0x0) goto LAB_001acafd;
            memset(pvStack_150,0,lVar7 * 0x30);
            local_160 = (int)local_1c8;
            local_15c = (int)local_1a0;
            local_158 = CONCAT44(local_158._4_4_,nList);
            local_148 = CONCAT44(local_148._4_4_,0xffffffff);
            pC_1 = (sqlite3_tokenizer_cursor *)pCsr_00;
            local_1b0 = fts3ExprIterate(pCsr_00->pExpr,fts3SnippetFindPositions,&pC_1);
            if (local_1b0 == 0) {
              uVar8 = (ulong)(uint)nList;
              if (nList < 1) {
                uVar8 = 0;
              }
              plVar18 = (long *)((long)pvStack_150 + 0x18);
              for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
                uVar14 = 1L << ((byte)uVar11 & 0x3f);
                if (*plVar18 == 0) {
                  uVar14 = 0;
                }
                local_1b8 = local_1b8 | uVar14;
                plVar18 = plVar18 + 6;
              }
              iVar13 = 0;
              uVar8 = 0;
              psVar20 = (sqlite3_vtab *)0x0;
              iVar5 = -1;
              do {
                local_110 = CONCAT44(local_110._4_4_,iVar13);
                local_198 = (sqlite3_tokenizer_cursor *)CONCAT44(local_198._4_4_,iVar5);
                local_108 = uVar8;
                local_100 = psVar20;
                do {
                  if ((int)local_148 < 0) {
                    local_148 = (ulong)local_148._4_4_ << 0x20;
                    lVar7 = 0x10;
                    lVar21 = 0;
                    while( true ) {
                      uVar11 = (ulong)(int)(uint)local_158;
                      if ((long)uVar11 <= lVar21) break;
                      fts3SnippetAdvance((char **)((long)pvStack_150 + lVar7 + 8),
                                         (int *)((long)pvStack_150 + lVar7),local_15c);
                      lVar21 = lVar21 + 1;
                      lVar7 = lVar7 + 0x30;
                    }
                  }
                  else {
                    uVar8 = 0;
                    if (0 < (int)(uint)local_158) {
                      uVar8 = local_158 & 0xffffffff;
                    }
                    iVar5 = 0x7fffffff;
                    for (lVar7 = 0; uVar8 * 0x30 - lVar7 != 0; lVar7 = lVar7 + 0x30) {
                      if ((*(long *)((long)pvStack_150 + lVar7 + 0x18) != 0) &&
                         (iVar13 = *(int *)((long)pvStack_150 + lVar7 + 0x10), iVar13 < iVar5)) {
                        iVar5 = iVar13;
                      }
                    }
                    if (iVar5 == 0x7fffffff) {
                      uVar8 = local_108;
                      pCsr_00 = local_118;
                      psVar20 = local_100;
                      iVar10 = (int)local_1c8;
                      iVar17 = (int)local_110;
                      goto LAB_001ac9d0;
                    }
                    iVar13 = (iVar5 - local_15c) + 1;
                    local_148 = CONCAT44(local_148._4_4_,iVar13);
                    lVar7 = 0x28;
                    for (lVar21 = 0; pvVar4 = pvStack_150, uVar11 = (ulong)(uint)local_158,
                        lVar21 < (int)(uint)local_158; lVar21 = lVar21 + 1) {
                      ppIter = (char **)((long)pvStack_150 + lVar7);
                      fts3SnippetAdvance((char **)((long)pvStack_150 + lVar7 + -0x10),
                                         (int *)((long)pvStack_150 + lVar7 + -0x18),iVar5 + 1);
                      fts3SnippetAdvance(ppIter,(int *)((long)pvVar4 + lVar7 + -8),iVar13);
                      lVar7 = lVar7 + 0x30;
                    }
                  }
                  lVar7 = local_148;
                  iVar13 = (int)local_148;
                  psVar20 = (sqlite3_vtab *)0x0;
                  uVar8 = 0;
                  iVar5 = 0;
                  for (uVar14 = 0; (long)uVar14 < (long)(int)uVar11; uVar14 = uVar14 + 1) {
                    pcVar19 = *(char **)((long)pvStack_150 + uVar14 * 0x30 + 0x28);
                    if (pcVar19 != (char *)0x0) {
                      puVar15 = (uint *)((long)pvStack_150 + uVar14 * 0x30);
                      pC._0_4_ = puVar15[8];
                      uVar11 = uVar8 | 1L << (uVar14 & 0x3f);
                      local_128 = uVar14;
                      pCsr_1 = pcVar19;
                      while ((iVar13 <= (int)(uint)pC && ((int)(uint)pC < local_15c + iVar13))) {
                        uVar16 = *puVar15;
                        if ((int)uVar16 < 1) {
                          uVar16 = 0;
                        }
                        for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
                          psVar20 = (sqlite3_vtab *)
                                    ((ulong)psVar20 |
                                    (ulong)(1L << ((char)(uint)pC - (char)lVar7 & 0x3fU)) >>
                                    ((byte)uVar12 & 0x3f));
                        }
                        iVar10 = iVar5 + 1;
                        iVar5 = iVar5 + 1000;
                        if (((uVar8 | local_1d8) & 1L << ((byte)uVar14 & 0x3f)) != 0) {
                          iVar5 = iVar10;
                        }
                        uVar8 = uVar11;
                        if ((byte)*pCsr_1 < 2) break;
                        fts3GetDeltaPosition(&pCsr_1,(int *)&pC);
                      }
                      uVar11 = local_158 & 0xffffffff;
                      uVar14 = local_128;
                    }
                  }
                } while (iVar5 <= (int)local_198);
              } while( true );
            }
            local_198 = (sqlite3_tokenizer_cursor *)((ulong)local_198 & 0xffffffff00000000);
            uVar8 = 0;
            psVar20 = (sqlite3_vtab *)0x0;
            iVar10 = 0;
            iVar17 = 0;
LAB_001ac9d0:
            sqlite3_free(pvStack_150);
            pContext = local_138;
            p = local_130;
            iVar5 = local_1b0;
            iVar13 = local_17c;
            if (local_1b0 != 0) goto LAB_001acafd;
            iVar5 = (int)local_190;
            if ((int)local_190 < (int)local_198) {
              *local_d0 = iVar10;
              local_d0[1] = iVar17;
              *(ulong *)(local_d0 + 2) = uVar8;
              *(sqlite3_vtab **)(local_d0 + 4) = psVar20;
              iVar5 = (int)local_198;
            }
            uVar8 = local_c8;
            uVar16 = (uint)local_140;
            iVar13 = (int)local_1c8;
          }
        }
        local_1d8 = local_1d8 | *(ulong *)(local_d0 + 2);
        uVar11 = local_b8 + 1;
      }
      if ((local_1b8 == local_1d8) || (uVar8 == 4)) goto LAB_001acb3b;
      uVar8 = uVar8 + 1;
    } while( true );
  }
  pcVar19 = "";
  iVar5 = 0;
  xDel = (_func_void_void_ptr *)0x0;
  goto LAB_001acb31;
code_r0x001acc73:
  iVar5 = 0;
  if (iCurrent < iVar13) goto LAB_001acc20;
  if (bVar2) goto LAB_001ace3e;
  if (uVar14 == 0) {
    uVar14 = 0;
  }
  else {
    uVar8 = 0;
    iVar5 = 1;
    do {
      iVar17 = iVar5;
      uVar11 = uVar8 & 0x3f;
      uVar8 = uVar8 + 1;
      iVar5 = iVar17 + 1;
    } while ((uVar14 >> uVar11 & 1) == 0);
    uVar16 = (uint)local_108;
    do {
      uVar8 = (ulong)uVar16;
      iVar17 = iVar17 + -1;
      uVar16 = uVar16 - 1;
    } while ((uVar14 >> (uVar8 & 0x3f) & 1) == 0);
    if (1 < iVar17) {
      iCurrent_1 = 0;
      local_190 = *(sqlite3_tokenizer_module **)&(local_100[3].pModule)->iVersion;
      iVar5 = sqlite3Fts3OpenTokenizer
                        ((sqlite3_tokenizer *)local_100[3].pModule,pCsr_00->iLangid,
                         (char *)(local_1c8 + iBegin),local_1b0 - iBegin,&pC_1);
      psVar3 = pC_1;
      if (iVar5 != 0) {
LAB_001acf07:
        bVar2 = true;
        psVar22 = local_1c0;
        goto LAB_001acc20;
      }
      iVar17 = iVar17 / 2 + (int)local_1a0;
      iVar5 = 0;
      while (iVar5 == 0) {
        if (iVar17 <= iCurrent_1) {
          (*local_190->xClose)(psVar3);
          goto LAB_001acdfe;
        }
        DUMMY1_1 = 0;
        DUMMY2 = 0;
        local_ec = 0;
        iVar5 = (*local_190->xNext)(psVar3,&pCsr_1,&DUMMY1_1,&DUMMY2,&local_ec,&iCurrent_1);
      }
      (*local_190->xClose)(psVar3);
      pCsr_00 = local_118;
      if (iVar5 != 0x65) goto LAB_001acf07;
LAB_001acdfe:
      iVar5 = iCurrent_1 - ((int)local_1a0 + -1 + (uint)(iVar5 == 0));
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      iVar13 = iVar13 + iVar5;
      uVar14 = uVar14 >> ((byte)iVar5 & 0x3f);
      pCsr_00 = local_118;
      psVar22 = local_1c0;
    }
  }
  if ((local_1b8 == 0) && (iVar13 < 1)) {
    puVar9 = local_1c8;
    iVar5 = iBegin;
    if (iBegin != 0) goto LAB_001acdb6;
  }
  else {
    puVar9 = local_e0;
    iVar5 = -1;
LAB_001acdb6:
    iVar5 = fts3StringAppend(&res,(char *)puVar9,iVar5);
    if (iVar5 != 0) {
      bVar2 = true;
      goto LAB_001acc20;
    }
  }
  bVar2 = true;
  iVar5 = 0;
  if (iCurrent < iVar13) goto LAB_001acc20;
LAB_001ace3e:
  if (iCurrent < (int)local_1a0 + iVar13) {
    cVar1 = (char)iCurrent;
    iVar5 = 0;
    if (iVar13 < iCurrent) {
      iVar5 = fts3StringAppend(&res,(char *)(local_1c8 + lVar7),iBegin - iVar10);
    }
    uVar8 = 1L << (cVar1 - (char)iVar13 & 0x3fU) & uVar14;
    if ((iVar5 == 0) && (uVar8 != 0)) {
      iVar5 = fts3StringAppend(&res,(char *)local_a8,-1);
    }
    if (((iVar5 == 0) &&
        (iVar5 = fts3StringAppend(&res,(char *)(local_1c8 + iBegin),local_1ac - iBegin), iVar5 == 0)
        ) && (uVar8 != 0)) {
      iVar5 = fts3StringAppend(&res,(char *)local_b0,-1);
    }
    local_128 = CONCAT44(local_128._4_4_,local_1ac);
    bVar2 = true;
    psVar22 = local_1c0;
    goto LAB_001acc20;
  }
  iVar5 = 0;
  puVar9 = local_e0;
  psVar22 = local_1c0;
  if (local_1b8 == local_140) {
LAB_001acf3e:
    iVar5 = fts3StringAppend(&res,(char *)puVar9,-1);
    psVar22 = local_1c0;
  }
LAB_001acf56:
  (*psVar22->xClose)(local_198);
  uVar8 = local_110;
LAB_001acf6f:
  uVar11 = local_1b8 + 1;
  p = local_130;
  goto LAB_001acb69;
LAB_001acb3b:
  local_140 = (ulong)((int)uVar8 - 1);
  uVar8 = uVar8 & 0xffffffff;
  local_108 = CONCAT44(local_108._4_4_,(int)local_1a0 + -1);
  uVar11 = 0;
  iVar5 = 0;
  local_110 = uVar8;
LAB_001acb69:
  pContext = local_138;
  iVar13 = local_17c;
  if ((uVar11 < uVar8) && (iVar5 == 0)) {
    psVar20 = (pCsr_00->base).pVtab;
    iCurrent = 0;
    iVar13 = local_98[uVar11 * 6 + 1];
    uVar14 = auStack_90[uVar11 * 3 + 1];
    iVar5 = local_98[uVar11 * 6] + 1;
    local_1b8 = uVar11;
    puVar9 = sqlite3_column_text(pCsr_00->pStmt,iVar5);
    if (puVar9 == (uchar *)0x0) {
      iVar13 = sqlite3_column_type(pCsr_00->pStmt,iVar5);
      iVar5 = 7;
      if (iVar13 == 5) {
        iVar5 = 0;
      }
    }
    else {
      local_1b0 = sqlite3_column_bytes(pCsr_00->pStmt,iVar5);
      pTokenizer = psVar20[3].pModule;
      local_1c0 = *(sqlite3_tokenizer_module **)&pTokenizer->iVersion;
      local_1c8 = puVar9;
      iVar5 = sqlite3Fts3OpenTokenizer
                        ((sqlite3_tokenizer *)pTokenizer,pCsr_00->iLangid,(char *)puVar9,local_1b0,
                         &pC);
      if (iVar5 == 0) {
        bVar2 = false;
        local_198 = (sqlite3_tokenizer_cursor *)CONCAT44(pC._4_4_,(uint)pC);
        local_128 = local_128 & 0xffffffff00000000;
        iVar5 = 0;
        psVar22 = local_1c0;
        local_100 = psVar20;
LAB_001acc20:
        if (iVar5 == 0) {
          DUMMY1 = -1;
          iBegin = 0;
          local_1ac = 0;
          iVar5 = (*psVar22->xNext)(local_198,(char **)&nList,&DUMMY1,&iBegin,&local_1ac,&iCurrent);
          iVar10 = (int)local_128;
          lVar7 = (long)(int)local_128;
          if (iVar5 == 0) goto code_r0x001acc73;
          psVar22 = local_1c0;
          if (iVar5 == 0x65) {
            puVar9 = local_1c8 + lVar7;
            goto LAB_001acf3e;
          }
        }
        goto LAB_001acf56;
      }
    }
    goto LAB_001acf6f;
  }
LAB_001acafd:
  local_17c = iVar13;
  sqlite3Fts3SegmentsClose(p);
  if (iVar5 != 0) {
    sqlite3_result_error_code(pContext,iVar5);
    sqlite3_free(res.z);
    return;
  }
  xDel = sqlite3_free;
  iVar5 = -1;
  pcVar19 = res.z;
LAB_001acb31:
  sqlite3_result_text(pContext,pcVar19,iVar5,xDel);
  return;
}

Assistant:

static void fts3SnippetFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of apVal[] array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  const char *zStart = "<b>";
  const char *zEnd = "</b>";
  const char *zEllipsis = "<b>...</b>";
  int iCol = -1;
  int nToken = 15;                /* Default number of tokens in snippet */

  /* There must be at least one argument passed to this function (otherwise
  ** the non-overloaded version would have been called instead of this one).
  */
  assert( nVal>=1 );

  if( nVal>6 ){
    sqlite3_result_error(pContext, 
        "wrong number of arguments to function snippet()", -1);
    return;
  }
  if( fts3FunctionArg(pContext, "snippet", apVal[0], &pCsr) ) return;

  switch( nVal ){
    case 6: nToken = sqlite3_value_int(apVal[5]);
    case 5: iCol = sqlite3_value_int(apVal[4]);
    case 4: zEllipsis = (const char*)sqlite3_value_text(apVal[3]);
    case 3: zEnd = (const char*)sqlite3_value_text(apVal[2]);
    case 2: zStart = (const char*)sqlite3_value_text(apVal[1]);
  }
  if( !zEllipsis || !zEnd || !zStart ){
    sqlite3_result_error_nomem(pContext);
  }else if( nToken==0 ){
    sqlite3_result_text(pContext, "", -1, SQLITE_STATIC);
  }else if( SQLITE_OK==fts3CursorSeek(pContext, pCsr) ){
    sqlite3Fts3Snippet(pContext, pCsr, zStart, zEnd, zEllipsis, iCol, nToken);
  }
}